

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O0

fourcc_t EBML_BufferToID(uint8_t *Buffer)

{
  uint8_t *Buffer_local;
  
  if (Buffer == (uint8_t *)0x0) {
    Buffer_local._4_4_ = 0;
  }
  else if ((*Buffer & 0x80) == 0) {
    if ((*Buffer & 0x40) == 0) {
      if ((*Buffer & 0x20) == 0) {
        if ((*Buffer & 0x10) == 0) {
          Buffer_local._4_4_ = 0;
        }
        else {
          Buffer_local._4_4_ =
               (uint)*Buffer * 0x1000000 + (uint)Buffer[1] * 0x10000 + (uint)Buffer[2] * 0x100 +
               (uint)Buffer[3];
        }
      }
      else {
        Buffer_local._4_4_ = (uint)*Buffer * 0x10000 + (uint)Buffer[1] * 0x100 + (uint)Buffer[2];
      }
    }
    else {
      Buffer_local._4_4_ = (uint)*Buffer * 0x100 + (uint)Buffer[1];
    }
  }
  else {
    Buffer_local._4_4_ = (uint)*Buffer;
  }
  return Buffer_local._4_4_;
}

Assistant:

fourcc_t EBML_BufferToID(const uint8_t *Buffer)
{
    if (Buffer == NULL)
        return 0;
    if (Buffer[0] & 0x80)
        return (fourcc_t)Buffer[0];
    if (Buffer[0] & 0x40)
        return (fourcc_t)((Buffer[0] << 8) + Buffer[1]);
    if (Buffer[0] & 0x20)
        return (fourcc_t)((Buffer[0] << 16) + (Buffer[1] << 8) + Buffer[2]);
    if (Buffer[0] & 0x10)
        return (fourcc_t)((Buffer[0] << 24) + (Buffer[1] << 16) + (Buffer[2] << 8) + Buffer[3]);
    return 0;
}